

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O3

DescriptorScriptData * __thiscall
cfd::AddressFactory::ParseOutputDescriptor
          (DescriptorScriptData *__return_storage_ptr__,AddressFactory *this,string *descriptor,
          string *bip32_derivation_path,
          vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *script_list
          ,vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
           *multisig_key_list,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  DescriptorScriptData *pDVar1;
  DescriptorScriptData *pDVar2;
  bool bVar3;
  bool bVar4;
  pointer pDVar5;
  char cVar6;
  uint uVar7;
  AddressType AVar8;
  uint32_t uVar9;
  DescriptorKeyType DVar10;
  int iVar11;
  uint32_t uVar12;
  undefined4 uVar13;
  DescriptorKeyReference *key_ref_00;
  DescriptorKeyReference *key_ref_01;
  DescriptorKeyReference *key_ref_02;
  DescriptorKeyReference *key_ref_03;
  DescriptorKeyReference *key_ref_04;
  KeyData *key;
  undefined1 __x [8];
  value_type *this_00;
  undefined1 auVar14 [8];
  DescriptorScriptReference *pDVar15;
  DescriptorScriptData *this_01;
  uint32_t index;
  uint uVar16;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_refs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_list;
  DescriptorScriptReference child;
  DescriptorKeyReference key_ref;
  Descriptor desc;
  DescriptorScriptData data;
  DescriptorNode node;
  DescriptorScriptReference *local_1358;
  DescriptorScriptReference *local_1350;
  AddressFactory *local_1340;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1338;
  string *local_1320;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *local_1318;
  Script *local_1310;
  string *local_1308;
  string *local_1300;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_12f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12d8;
  undefined1 local_12b8 [8];
  undefined1 auStack_12b0 [8];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [40];
  pointer local_1270;
  pointer local_1260;
  pointer local_1258;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1240 [5];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_11c8;
  Script local_11b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1170 [2];
  AddressType local_10f8;
  Script local_10f0;
  DescriptorKeyType local_10b8;
  string local_10b0 [328];
  undefined1 local_f68 [32];
  undefined1 local_f48 [208];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_e78;
  Script local_e60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e20 [10];
  undefined1 local_c18 [32];
  undefined1 local_bf8 [208];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b28;
  Script local_b10;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ad0 [10];
  DescriptorKeyReference local_8c8 [656];
  string local_638 [360];
  undefined1 local_4d0 [552];
  uint32_t local_2a8;
  DescriptorNode local_198 [292];
  DescriptorScriptType local_74;
  
  local_1340 = this;
  local_1318 = multisig_key_list;
  if (script_list !=
      (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
    pDVar1 = *(DescriptorScriptData **)script_list;
    pDVar2 = *(DescriptorScriptData **)(script_list + 8);
    this_01 = pDVar1;
    if (pDVar2 != pDVar1) {
      do {
        DescriptorScriptData::~DescriptorScriptData(this_01);
        this_01 = this_01 + 1;
      } while (this_01 != pDVar2);
      *(DescriptorScriptData **)(script_list + 8) = pDVar1;
    }
  }
  if (local_1318 != (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0)
  {
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::clear(local_1318);
  }
  DescriptorScriptData::DescriptorScriptData(__return_storage_ptr__);
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->address_type = kP2shAddress;
  __return_storage_ptr__->multisig_req_sig_num = 0;
  cfd::core::Descriptor::Parse(local_638,(vector *)descriptor);
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar16 = 0; uVar7 = cfd::core::Descriptor::GetNeedArgumentNum(), uVar16 < uVar7;
      uVar16 = uVar16 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_12d8,bip32_derivation_path);
  }
  if (key_list != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    cfd::core::Descriptor::GetKeyDataAll((vector *)local_12b8);
    auVar14 = auStack_12b0;
    for (__x = local_12b8; __x != auVar14; __x = (undefined1  [8])((long)__x + 0x150)) {
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                (key_list,(value_type *)__x);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_12b8);
  }
  cfd::core::Descriptor::GetReferenceAll((vector *)&local_1358);
  cfd::core::Descriptor::GetNode();
  __return_storage_ptr__->type = local_74;
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->depth = 0;
  cfd::core::DescriptorScriptReference::GetLockingScript();
  cfd::core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)local_12b8);
  core::Script::~Script((Script *)local_12b8);
  cVar6 = cfd::core::DescriptorScriptReference::HasAddress();
  if (cVar6 != '\0') {
    cfd::core::DescriptorScriptReference::GenerateAddress((NetType)local_12b8);
    cfd::core::Address::operator=(&__return_storage_ptr__->address,(Address *)local_12b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_1170);
    core::Script::~Script(&local_11b0);
    local_1240[0].
    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_11c8);
    core::TapBranch::~TapBranch((TapBranch *)local_1240);
    if (local_1258 != (pointer)0x0) {
      operator_delete(local_1258);
    }
    if (local_1270 != (pointer)0x0) {
      operator_delete(local_1270);
    }
    if ((pointer)local_1298._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_1298._16_8_);
    }
    if ((pointer)local_12a8._0_8_ != (pointer)local_1298) {
      operator_delete((void *)local_12a8._0_8_);
    }
    AVar8 = cfd::core::DescriptorScriptReference::GetAddressType();
    __return_storage_ptr__->address_type = AVar8;
  }
  cVar6 = cfd::core::DescriptorScriptReference::HasRedeemScript();
  if (cVar6 != '\0') {
    cfd::core::DescriptorScriptReference::GetRedeemScript();
    cfd::core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)local_12b8);
    core::Script::~Script((Script *)local_12b8);
  }
  local_1338.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1338.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1338.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::DescriptorKeyReference::DescriptorKeyReference(local_8c8);
  switch(__return_storage_ptr__->type) {
  case kDescriptorScriptSh:
  case kDescriptorScriptWsh:
    cfd::core::DescriptorScriptReference::DescriptorScriptReference
              ((DescriptorScriptReference *)local_12b8,local_1358);
    cVar6 = cfd::core::DescriptorScriptReference::HasChild();
    if (cVar6 == '\0') {
      cfd::core::DescriptorScriptReference::GetRedeemScript();
    }
    else {
      cfd::core::Script::Script((Script *)local_f68);
    }
    local_1310 = &__return_storage_ptr__->redeem_script;
    cfd::core::Script::operator=(local_1310,(Script *)local_f68);
    core::Script::~Script((Script *)local_f68);
    if (cVar6 != '\0') {
      local_1300 = (string *)(local_4d0 + 0x208);
      local_1308 = (string *)&__return_storage_ptr__->key;
      bVar4 = true;
      bVar3 = true;
      local_1320 = (string *)cfd::core::Psbt::CheckTxInIndex;
      uVar9 = 0;
      uVar12 = 0;
      do {
        cfd::core::DescriptorScriptReference::DescriptorScriptReference
                  ((DescriptorScriptReference *)local_f68);
        DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)local_4d0);
        iVar11 = cfd::core::DescriptorScriptReference::GetScriptType();
        if (iVar11 - 1U < 2) {
          cVar6 = cfd::core::DescriptorScriptReference::HasChild();
          if (cVar6 == '\0') {
            cfd::core::DescriptorScriptReference::GetRedeemScript();
            cfd::core::Script::operator=(local_1310,(Script *)local_c18);
          }
          else {
            cfd::core::DescriptorScriptReference::GetChild();
            cfd::core::DescriptorScriptReference::operator=
                      ((DescriptorScriptReference *)local_f68,(DescriptorScriptReference *)local_c18
                      );
            core::DescriptorScriptReference::~DescriptorScriptReference
                      ((DescriptorScriptReference *)local_c18);
            iVar11 = cfd::core::DescriptorScriptReference::GetScriptType();
            if ((iVar11 == 7) ||
               (iVar11 = cfd::core::DescriptorScriptReference::GetScriptType(), iVar11 == 8)) {
              cfd::core::DescriptorScriptReference::GetKeyList();
              local_c18._16_8_ =
                   local_1338.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c18._8_8_ =
                   local_1338.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_c18._0_8_ =
                   local_1338.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_1338.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_12f8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_1338.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_12f8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_1338.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_12f8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_12f8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_12f8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_12f8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)local_c18);
              std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::~vector(&local_12f8);
              uVar12 = cfd::core::DescriptorScriptReference::GetReqNum();
              __return_storage_ptr__->multisig_req_sig_num = uVar12;
              bVar3 = false;
            }
            else {
              iVar11 = cfd::core::DescriptorScriptReference::GetScriptType();
              bVar3 = bVar4;
              if (iVar11 == 0xb) {
                bVar3 = false;
              }
            }
            iVar11 = cfd::core::DescriptorScriptReference::GetScriptType();
            bVar4 = bVar3;
            if (iVar11 == 5) goto LAB_001e1115;
            cfd::core::DescriptorScriptReference::GetRedeemScript();
            cfd::core::Script::operator=(local_1310,(Script *)local_c18);
          }
          core::Script::~Script((Script *)local_c18);
        }
        else {
          bVar4 = false;
          bVar3 = false;
        }
LAB_001e1115:
        local_4d0._0_4_ = cfd::core::DescriptorScriptReference::GetScriptType();
        local_4d0._64_4_ = uVar9;
        cfd::core::DescriptorScriptReference::GetLockingScript();
        cfd::core::Script::operator=((Script *)(local_4d0 + 8),(Script *)local_c18);
        core::Script::~Script((Script *)local_c18);
        cfd::core::DescriptorScriptReference::GenerateAddress((NetType)(Script *)local_c18);
        cfd::core::Address::operator=((Address *)(local_4d0 + 0x48),(Address *)local_c18);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_ad0);
        core::Script::~Script(&local_b10);
        local_bf8._88_8_ = local_1320;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_b28);
        core::TapBranch::~TapBranch((TapBranch *)(local_bf8 + 0x58));
        if ((pointer)local_bf8._64_8_ != (pointer)0x0) {
          operator_delete((void *)local_bf8._64_8_);
        }
        if ((pointer)local_bf8._40_8_ != (pointer)0x0) {
          operator_delete((void *)local_bf8._40_8_);
        }
        if ((pointer)local_bf8._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_bf8._16_8_);
        }
        if ((pointer)local_c18._16_8_ != (pointer)local_bf8) {
          operator_delete((void *)local_c18._16_8_);
        }
        local_4d0._448_4_ = cfd::core::DescriptorScriptReference::GetAddressType();
        cVar6 = cfd::core::DescriptorScriptReference::HasRedeemScript();
        if (cVar6 != '\0') {
          cfd::core::DescriptorScriptReference::GetRedeemScript();
          cfd::core::Script::operator=((Script *)(local_4d0 + 0x1c8),(Script *)local_c18);
          core::Script::~Script((Script *)local_c18);
        }
        cVar6 = cfd::core::DescriptorScriptReference::HasKey();
        if (cVar6 == '\0') {
          local_4d0._512_4_ = kDescriptorKeyNull;
        }
        else {
          cfd::core::DescriptorScriptReference::GetKeyList();
          cfd::core::DescriptorKeyReference::operator=
                    (local_8c8,(DescriptorKeyReference *)local_c18._0_8_);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)local_c18);
          local_4d0._512_4_ = cfd::core::DescriptorKeyReference::GetKeyType();
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)local_c18,local_8c8,key_ref_02);
          std::__cxx11::string::operator=(local_1300,(string *)local_c18);
          if ((value_type *)local_c18._0_8_ != (value_type *)(local_c18 + 0x10)) {
            operator_delete((void *)local_c18._0_8_);
          }
          DVar10 = cfd::core::DescriptorKeyReference::GetKeyType();
          __return_storage_ptr__->key_type = DVar10;
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)local_c18,local_8c8,key_ref_03);
          std::__cxx11::string::operator=(local_1308,(string *)local_c18);
          if ((value_type *)local_c18._0_8_ != (value_type *)(local_c18 + 0x10)) {
            operator_delete((void *)local_c18._0_8_);
          }
        }
        local_2a8 = uVar12;
        if (script_list !=
            (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
          std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
          push_back(script_list,(value_type *)local_4d0);
        }
        if ((bVar3) && (cVar6 = cfd::core::DescriptorScriptReference::HasChild(), cVar6 != '\0')) {
          cfd::core::DescriptorScriptReference::GetChild();
          cfd::core::DescriptorScriptReference::operator=
                    ((DescriptorScriptReference *)local_f68,(DescriptorScriptReference *)local_c18);
          core::DescriptorScriptReference::~DescriptorScriptReference
                    ((DescriptorScriptReference *)local_c18);
          cfd::core::DescriptorScriptReference::operator=
                    ((DescriptorScriptReference *)local_12b8,(DescriptorScriptReference *)local_f68)
          ;
          uVar9 = uVar9 + 1;
        }
        else {
          bVar4 = false;
          bVar3 = false;
        }
        DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_4d0);
        core::DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)local_f68);
      } while (bVar3);
    }
    core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)local_12b8);
    break;
  case kDescriptorScriptPk:
  case kDescriptorScriptPkh:
  case kDescriptorScriptWpkh:
    cfd::core::DescriptorScriptReference::GetKeyList();
    cfd::core::DescriptorKeyReference::operator=(local_8c8,(DescriptorKeyReference *)local_12b8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_12b8);
    DVar10 = cfd::core::DescriptorKeyReference::GetKeyType();
    __return_storage_ptr__->key_type = DVar10;
    const::$_0::operator()::DescriptorKeyReference_const___const
              ((string *)local_12b8,local_8c8,key_ref_00);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_12b8);
    auVar14 = local_12b8;
    if (local_12b8 == (undefined1  [8])local_12a8) break;
    goto LAB_001e14e8;
  case kDescriptorScriptCombo:
    if (local_1358 != local_1350) {
      local_1320 = (string *)&__return_storage_ptr__->key;
      pDVar15 = local_1358;
      do {
        DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)local_12b8);
        uVar13 = cfd::core::DescriptorScriptReference::GetScriptType();
        local_12b8._0_4_ = uVar13;
        local_1298._32_4_ = 0;
        cfd::core::DescriptorScriptReference::GetLockingScript();
        cfd::core::Script::operator=((Script *)auStack_12b0,(Script *)local_f68);
        core::Script::~Script((Script *)local_f68);
        cVar6 = cfd::core::DescriptorScriptReference::HasAddress();
        AVar8 = kP2shAddress;
        if (cVar6 != '\0') {
          cfd::core::DescriptorScriptReference::GenerateAddress((NetType)(Script *)local_f68);
          cfd::core::Address::operator=((Address *)&local_1270,(Address *)local_f68);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_e20);
          core::Script::~Script(&local_e60);
          local_f48._88_8_ = cfd::core::Psbt::CheckTxInIndex;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&local_e78);
          core::TapBranch::~TapBranch((TapBranch *)(local_f48 + 0x58));
          if ((pointer)local_f48._64_8_ != (pointer)0x0) {
            operator_delete((void *)local_f48._64_8_);
          }
          if ((pointer)local_f48._40_8_ != (pointer)0x0) {
            operator_delete((void *)local_f48._40_8_);
          }
          if ((pointer)local_f48._16_8_ != (pointer)0x0) {
            operator_delete((void *)local_f48._16_8_);
          }
          if ((pointer)local_f68._16_8_ != (pointer)local_f48) {
            operator_delete((void *)local_f68._16_8_);
          }
          AVar8 = cfd::core::DescriptorScriptReference::GetAddressType();
        }
        local_10f8 = AVar8;
        cVar6 = cfd::core::DescriptorScriptReference::HasRedeemScript();
        if (cVar6 == '\0') {
          cfd::core::DescriptorScriptReference::GetKeyList();
          cfd::core::DescriptorKeyReference::operator=
                    (local_8c8,(DescriptorKeyReference *)local_f68._0_8_);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)local_f68);
          local_10b8 = cfd::core::DescriptorKeyReference::GetKeyType();
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)local_f68,local_8c8,key_ref_01);
          std::__cxx11::string::operator=(local_10b0,(string *)local_f68);
          if ((value_type *)local_f68._0_8_ != (value_type *)(local_f68 + 0x10)) {
            operator_delete((void *)local_f68._0_8_);
          }
          if (__return_storage_ptr__->key_type == kDescriptorKeyNull) {
            __return_storage_ptr__->key_type = local_10b8;
            std::__cxx11::string::_M_assign(local_1320);
          }
        }
        else {
          cfd::core::DescriptorScriptReference::GetRedeemScript();
          cfd::core::Script::operator=(&local_10f0,(Script *)local_f68);
          core::Script::~Script((Script *)local_f68);
          local_10b8 = kDescriptorKeyNull;
        }
        if (script_list !=
            (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
          std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
          push_back(script_list,(DescriptorScriptData *)local_12b8);
        }
        DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_12b8);
        pDVar15 = pDVar15 + 0x350;
      } while (pDVar15 != local_1350);
    }
    break;
  case kDescriptorScriptMulti:
  case kDescriptorScriptSortedMulti:
    cfd::core::DescriptorScriptReference::GetKeyList();
    local_12a8._0_8_ =
         local_1338.
         super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_12b0 = (undefined1  [8])
                   local_1338.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_12b8 = (undefined1  [8])
                 local_1338.
                 super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_1338.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f68._16_8_;
    local_1338.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f68._0_8_;
    local_1338.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f68._8_8_;
    local_f68._0_8_ = (value_type *)0x0;
    local_f68._8_8_ = (value_type *)0x0;
    local_f68._16_8_ = (pointer)0x0;
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_12b8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_f68);
    uVar9 = cfd::core::DescriptorScriptReference::GetReqNum();
    __return_storage_ptr__->multisig_req_sig_num = uVar9;
    break;
  case kDescriptorScriptTaproot:
    cfd::core::DescriptorScriptReference::GetKeyList();
    cfd::core::DescriptorKeyReference::operator=(local_8c8,(DescriptorKeyReference *)local_12b8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_12b8);
    cfd::core::DescriptorScriptReference::GetTapBranch();
    cfd::core::TapBranch::operator=(&__return_storage_ptr__->branch,(TapBranch *)local_12b8);
    core::TapBranch::~TapBranch((TapBranch *)local_12b8);
    cfd::core::DescriptorScriptReference::GetScriptTree();
    cfd::core::TaprootScriptTree::operator=
              (&__return_storage_ptr__->tree,(TaprootScriptTree *)local_12b8);
    local_12b8 = (undefined1  [8])cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (local_1240);
    core::TapBranch::~TapBranch((TapBranch *)local_12b8);
    DVar10 = cfd::core::DescriptorKeyReference::GetKeyType();
    __return_storage_ptr__->key_type = DVar10;
    cVar6 = cfd::core::DescriptorKeyReference::HasExtPrivkey();
    if (cVar6 == '\0') {
      cVar6 = cfd::core::DescriptorKeyReference::HasExtPubkey();
      if (cVar6 != '\0') {
        cfd::core::DescriptorKeyReference::GetExtPubkey();
        cfd::core::ExtPubkey::ToString_abi_cxx11_();
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_f68);
        if ((value_type *)local_f68._0_8_ != (value_type *)(local_f68 + 0x10)) {
          operator_delete((void *)local_f68._0_8_);
        }
        goto LAB_001e1439;
      }
      __return_storage_ptr__->key_type = kDescriptorKeySchnorr;
      cfd::core::DescriptorKeyReference::GetSchnorrPubkey();
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_12b8);
      auVar14 = (undefined1  [8])local_f68._0_8_;
      if (local_12b8 != (undefined1  [8])local_12a8) {
        operator_delete((void *)local_12b8);
        auVar14 = (undefined1  [8])local_f68._0_8_;
      }
    }
    else {
      cfd::core::DescriptorKeyReference::GetExtPrivkey();
      cfd::core::ExtPrivkey::ToString_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_f68);
      local_1260 = local_1258;
      if ((value_type *)local_f68._0_8_ != (value_type *)(local_f68 + 0x10)) {
        operator_delete((void *)local_f68._0_8_);
        local_1260 = local_1258;
      }
LAB_001e1439:
      if (local_1260 != (pointer)0x0) {
        operator_delete(local_1260);
      }
      if ((void *)CONCAT44(local_1298._36_4_,local_1298._32_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_1298._36_4_,local_1298._32_4_));
      }
      auVar14 = local_12b8;
      if ((pointer)local_1298._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_1298._8_8_);
        auVar14 = local_12b8;
      }
    }
    if (auVar14 == (undefined1  [8])0x0) break;
LAB_001e14e8:
    operator_delete((void *)auVar14);
  }
  pDVar5 = local_1338.
           super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1338.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1338.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      local_1318 != (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0)
  {
    this_00 = (value_type *)
              local_1338.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar13 = cfd::core::DescriptorKeyReference::GetKeyType();
      local_12b8._0_4_ = uVar13;
      const::$_0::operator()::DescriptorKeyReference_const___const
                ((string *)auStack_12b0,this_00,key_ref_04);
      std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::push_back
                (local_1318,(value_type *)local_12b8);
      if (auStack_12b0 != (undefined1  [8])(local_12a8 + 8)) {
        operator_delete((void *)auStack_12b0);
      }
      this_00 = (value_type *)
                &this_00[1].fingerprint_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    } while (this_00 != (value_type *)pDVar5);
  }
  core::DescriptorKeyReference::~DescriptorKeyReference(local_8c8);
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector(&local_1338);
  core::DescriptorNode::~DescriptorNode(local_198);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)&local_1358);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_12d8);
  core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_638);
  return __return_storage_ptr__;
}

Assistant:

DescriptorScriptData AddressFactory::ParseOutputDescriptor(
    const std::string& descriptor, const std::string& bip32_derivation_path,
    std::vector<DescriptorScriptData>* script_list,
    std::vector<DescriptorKeyData>* multisig_key_list,
    std::vector<KeyData>* key_list) const {
  if (script_list != nullptr) script_list->clear();
  if (multisig_key_list != nullptr) multisig_key_list->clear();

  static auto get_keystr_function =
      [](const DescriptorKeyReference& key_ref) -> std::string {
    if (key_ref.HasExtPrivkey()) {
      return key_ref.GetExtPrivkey().ToString();
    } else if (key_ref.HasExtPubkey()) {
      return key_ref.GetExtPubkey().ToString();
    } else {
      return key_ref.GetPubkey().GetHex();
    }
  };

  DescriptorScriptData result;
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;  // dummy init
  result.address_type = AddressType::kP2shAddress;          // dummy init
  result.multisig_req_sig_num = 0;
  Descriptor desc = Descriptor::Parse(descriptor, &prefix_list_);
  std::vector<std::string> args;
  for (uint32_t index = 0; index < desc.GetNeedArgumentNum(); ++index) {
    args.push_back(bip32_derivation_path);
  }
  if (key_list != nullptr) {
    auto temp_list = desc.GetKeyDataAll(&args);
    for (const auto& key : temp_list) {
      key_list->push_back(key);
    }
  }
  std::vector<DescriptorScriptReference> script_refs =
      desc.GetReferenceAll(&args);
  DescriptorNode node = desc.GetNode();

  result.type = node.GetScriptType();
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;
  result.depth = 0;
  result.locking_script = script_refs[0].GetLockingScript();
  if (script_refs[0].HasAddress()) {
    result.address = script_refs[0].GenerateAddress(type_);
    result.address_type = script_refs[0].GetAddressType();
  }
  if (script_refs[0].HasRedeemScript()) {
    result.redeem_script = script_refs[0].GetRedeemScript();
  }

  std::vector<DescriptorKeyReference> multisig_keys;
  uint32_t multisig_req_num = 0;
  bool use_script_list = false;
  DescriptorKeyReference key_ref;
  switch (result.type) {
    case DescriptorScriptType::kDescriptorScriptCombo:
      for (const auto& ref : script_refs) {
        DescriptorScriptData ref_data;
        ref_data.type = ref.GetScriptType();
        ref_data.depth = 0;
        ref_data.locking_script = ref.GetLockingScript();
        if (ref.HasAddress()) {
          ref_data.address = ref.GenerateAddress(type_);
          ref_data.address_type = ref.GetAddressType();
        } else {
          ref_data.address_type = AddressType::kP2shAddress;  // dummy init
        }
        if (ref.HasRedeemScript()) {
          ref_data.redeem_script = ref.GetRedeemScript();
          ref_data.key_type = DescriptorKeyType::kDescriptorKeyNull;
        } else {
          key_ref = ref.GetKeyList()[0];
          ref_data.key_type = key_ref.GetKeyType();
          ref_data.key = get_keystr_function(key_ref);
          if (result.key_type == DescriptorKeyType::kDescriptorKeyNull) {
            result.key_type = ref_data.key_type;
            result.key = ref_data.key;
          }
        }
        if (script_list != nullptr) script_list->push_back(ref_data);
      }
      break;
    case DescriptorScriptType::kDescriptorScriptSh:
    case DescriptorScriptType::kDescriptorScriptWsh:
      use_script_list = true;
      break;
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptWpkh:
      key_ref = script_refs[0].GetKeyList()[0];
      result.key_type = key_ref.GetKeyType();
      result.key = get_keystr_function(key_ref);
      break;
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      multisig_keys = script_refs[0].GetKeyList();
      result.multisig_req_sig_num = script_refs[0].GetReqNum();
      break;
    case DescriptorScriptType::kDescriptorScriptTaproot:
      key_ref = script_refs[0].GetKeyList()[0];
      result.branch = script_refs[0].GetTapBranch();
      result.tree = script_refs[0].GetScriptTree();
      result.key_type = key_ref.GetKeyType();
      if (key_ref.HasExtPrivkey()) {
        result.key = key_ref.GetExtPrivkey().ToString();
      } else if (key_ref.HasExtPubkey()) {
        result.key = key_ref.GetExtPubkey().ToString();
      } else {
        result.key_type = DescriptorKeyType::kDescriptorKeySchnorr;
        result.key = key_ref.GetSchnorrPubkey().GetHex();
      }
      break;
    case DescriptorScriptType::kDescriptorScriptRaw:
    case DescriptorScriptType::kDescriptorScriptAddr:
    default:
      break;
  }

  if (use_script_list) {
    DescriptorScriptReference script_ref = script_refs[0];
    bool is_loop = script_ref.HasChild();
    uint32_t depth = 0;
    result.redeem_script = (is_loop) ? Script() : script_ref.GetRedeemScript();
    while (is_loop) {
      DescriptorScriptReference child;
      DescriptorScriptData data;
      switch (script_ref.GetScriptType()) {
        case DescriptorScriptType::kDescriptorScriptSh:
        case DescriptorScriptType::kDescriptorScriptWsh:
          if (!script_ref.HasChild()) {
            result.redeem_script = script_ref.GetRedeemScript();
          } else {
            child = script_ref.GetChild();
            if ((child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptMulti) ||
                (child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptSortedMulti)) {
              multisig_keys = child.GetKeyList();
              multisig_req_num = child.GetReqNum();
              result.multisig_req_sig_num = multisig_req_num;
              is_loop = false;
            } else if (
                child.GetScriptType() ==
                DescriptorScriptType::kDescriptorScriptMiniscript) {
              is_loop = false;
            }
            if (child.GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptWpkh) {
              result.redeem_script = script_ref.GetRedeemScript();
            }
          }
          break;
        // case DescriptorScriptType::kDescriptorScriptPk:
        // case DescriptorScriptType::kDescriptorScriptPkh:
        // case DescriptorScriptType::kDescriptorScriptWpkh:
        default:
          is_loop = false;
          break;
      }
      data.type = script_ref.GetScriptType();
      data.depth = depth;
      data.locking_script = script_ref.GetLockingScript();
      data.address = script_ref.GenerateAddress(type_);
      data.address_type = script_ref.GetAddressType();
      if (script_ref.HasRedeemScript()) {
        data.redeem_script = script_ref.GetRedeemScript();
      }
      if (script_ref.HasKey()) {
        key_ref = script_ref.GetKeyList()[0];
        data.key_type = key_ref.GetKeyType();
        data.key = get_keystr_function(key_ref);
        result.key_type = key_ref.GetKeyType();
        result.key = get_keystr_function(key_ref);
      } else {
        data.key_type = DescriptorKeyType::kDescriptorKeyNull;
      }
      data.multisig_req_sig_num = multisig_req_num;

      if (script_list != nullptr) script_list->push_back(data);
      if (is_loop && script_ref.HasChild()) {
        child = script_ref.GetChild();
        script_ref = child;
        ++depth;
      } else {
        is_loop = false;
      }
    }
  }

  if ((!multisig_keys.empty()) && multisig_key_list) {
    for (const auto& ref : multisig_keys) {
      DescriptorKeyData key_data{ref.GetKeyType(), get_keystr_function(ref)};
      multisig_key_list->push_back(key_data);
    }
  }
  return result;
}